

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMiscTest_ParseMultipleImports_Test::
ParseMiscTest_ParseMultipleImports_Test(ParseMiscTest_ParseMultipleImports_Test *this)

{
  ParseMiscTest_ParseMultipleImports_Test *this_local;
  
  ParserTest::ParserTest(&this->super_ParseMiscTest);
  (this->super_ParseMiscTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ParseMiscTest_ParseMultipleImports_Test_02a0ba48;
  return;
}

Assistant:

TEST_F(ParseMiscTest, ParseMultipleImports) {
  ExpectParsesTo(
      "import \"foo.proto\";\n"
      "import \"bar.proto\";\n"
      "import \"baz.proto\";\n",
      "dependency: \"foo.proto\""
      "dependency: \"bar.proto\""
      "dependency: \"baz.proto\"");
}